

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JPEGImageParser.cpp
# Opt level: O3

TwoLevelStatus __thiscall
JPEGImageParser::ReadStreamToBuffer
          (JPEGImageParser *this,unsigned_long inAmountToRead,unsigned_long *refReadLimit)

{
  int iVar1;
  undefined4 extraout_var;
  TwoLevelStatus TVar2;
  
  if (*refReadLimit < inAmountToRead) {
    TVar2.primary = eSuccess;
    TVar2.secondary = eFailure;
  }
  else {
    iVar1 = (*(this->mImageStream->super_IByteReader)._vptr_IByteReader[2])
                      (this->mImageStream,this->mReadBuffer,inAmountToRead);
    TVar2.primary = eFailure;
    TVar2.secondary = eSuccess;
    if (CONCAT44(extraout_var,iVar1) == inAmountToRead) {
      *refReadLimit = *refReadLimit - inAmountToRead;
      TVar2.primary = eSuccess;
      TVar2.secondary = eSuccess;
    }
  }
  return TVar2;
}

Assistant:

TwoLevelStatus JPEGImageParser::ReadStreamToBuffer(unsigned long inAmountToRead,unsigned long& refReadLimit)
{
	if (refReadLimit < inAmountToRead)
		return TwoLevelStatus(PDFHummus::eSuccess, PDFHummus::eFailure);
	EStatusCode status = ReadStreamToBuffer(inAmountToRead);
	if (status == PDFHummus::eSuccess)
		refReadLimit -= inAmountToRead;
	return TwoLevelStatus(status, PDFHummus::eSuccess);
}